

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.cpp
# Opt level: O0

int __thiscall anon_unknown.dwarf_211787::AlsaPlayback::mixerProc(AlsaPlayback *this)

{
  ALCdevice *this_00;
  FILE *pFVar1;
  bool bVar2;
  ALuint AVar3;
  int iVar4;
  undefined8 uVar5;
  ulong uVar6;
  long in_RDI;
  size_t in_stack_00000038;
  ALuint in_stack_00000044;
  void *in_stack_00000048;
  ALCdevice *in_stack_00000050;
  snd_pcm_sframes_t commitres;
  char *WritePtr;
  int err_1;
  snd_pcm_uframes_t offset;
  snd_pcm_channel_area_t *areas;
  snd_pcm_uframes_t frames;
  lock_guard<std::mutex> _;
  int err;
  snd_pcm_uframes_t avail;
  snd_pcm_sframes_t avails;
  int state;
  snd_pcm_uframes_t buffer_size;
  snd_pcm_uframes_t update_size;
  size_t samplebits;
  mutex_type *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  memory_order in_stack_ffffffffffffff14;
  FILE *in_stack_ffffffffffffff18;
  undefined8 local_60;
  undefined8 local_58;
  ulong local_50 [2];
  int local_3c;
  ulong local_38;
  ulong local_30;
  int local_24;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  SetRTPriority();
  althrd_setname("alsoft-mixer");
  AVar3 = ALCdevice::bytesFromFmt((ALCdevice *)0x2324cb);
  local_10 = (ulong)(AVar3 << 3);
  local_18 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x10);
  local_20 = (ulong)*(uint *)(*(long *)(in_RDI + 8) + 0x14);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          bVar2 = std::atomic<bool>::load
                            ((atomic<bool> *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff14);
          if (((bVar2 ^ 0xffU) & 1) == 0) {
            return 0;
          }
          local_24 = verify_state((snd_pcm_t *)in_stack_ffffffffffffff18);
          pFVar1 = gLogFile;
          if (local_24 < 0) {
            if (0 < (int)gLogLevel) {
              uVar5 = (*(anonymous_namespace)::psnd_strerror)(local_24);
              fprintf((FILE *)pFVar1,"[ALSOFT] (EE) Invalid state detected: %s\n",uVar5);
            }
            this_00 = *(ALCdevice **)(in_RDI + 8);
            uVar5 = (*(anonymous_namespace)::psnd_strerror)(local_24);
            ALCdevice::handleDisconnect(this_00,"Bad state: %s",uVar5);
            return 0;
          }
          local_30 = (*(anonymous_namespace)::psnd_pcm_avail_update)(*(undefined8 *)(in_RDI + 0x10))
          ;
          pFVar1 = gLogFile;
          if (-1 < (long)local_30) break;
          if (0 < (int)gLogLevel) {
            uVar5 = (*(anonymous_namespace)::psnd_strerror)(local_30 & 0xffffffff);
            fprintf((FILE *)pFVar1,"[ALSOFT] (EE) available update failed: %s\n",uVar5);
          }
        }
        local_38 = local_30;
        if (local_30 <= local_20) break;
        if (1 < (int)gLogLevel) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (WW) available samples exceeds the buffer size\n");
        }
        (*(anonymous_namespace)::psnd_pcm_reset)(*(undefined8 *)(in_RDI + 0x10));
      }
      if (local_18 <= local_30) break;
      if ((local_24 == 3) ||
         (local_3c = (*(anonymous_namespace)::psnd_pcm_start)(*(undefined8 *)(in_RDI + 0x10)),
         pFVar1 = gLogFile, -1 < local_3c)) {
        iVar4 = (*(anonymous_namespace)::psnd_pcm_wait)(*(undefined8 *)(in_RDI + 0x10),1000);
        if ((iVar4 == 0) && (0 < (int)gLogLevel)) {
          fprintf((FILE *)gLogFile,"[ALSOFT] (EE) Wait timeout... buffer size too low?\n");
        }
      }
      else if (0 < (int)gLogLevel) {
        uVar5 = (*(anonymous_namespace)::psnd_strerror)(local_3c);
        fprintf((FILE *)pFVar1,"[ALSOFT] (EE) start failed: %s\n",uVar5);
      }
    }
    local_38 = local_30 - local_30 % local_18;
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
               in_stack_ffffffffffffff08);
    for (; local_38 != 0; local_38 = local_38 - local_50[0]) {
      local_50[0] = local_38;
      local_58 = 0;
      local_60 = 0;
      iVar4 = (*(anonymous_namespace)::psnd_pcm_mmap_begin)
                        (*(undefined8 *)(in_RDI + 0x10),&local_58,&local_60,local_50);
      pFVar1 = gLogFile;
      if (iVar4 < 0) {
        if (0 < (int)gLogLevel) {
          uVar5 = (*(anonymous_namespace)::psnd_strerror)(iVar4);
          fprintf((FILE *)pFVar1,"[ALSOFT] (EE) mmap begin error: %s\n",uVar5);
        }
        break;
      }
      ALCdevice::renderSamples
                (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038);
      uVar6 = (*(anonymous_namespace)::psnd_pcm_mmap_commit)
                        (*(undefined8 *)(in_RDI + 0x10),local_60,local_50[0]);
      if (((long)uVar6 < 0) || (uVar6 != local_50[0])) {
        if (0 < (int)gLogLevel) {
          if ((long)uVar6 < 0) {
            in_stack_ffffffffffffff14 = (memory_order)uVar6;
          }
          else {
            in_stack_ffffffffffffff14 = 0xffffffe0;
          }
          in_stack_ffffffffffffff18 = (FILE *)gLogFile;
          in_stack_ffffffffffffff08 =
               (mutex_type *)(*(anonymous_namespace)::psnd_strerror)(in_stack_ffffffffffffff14);
          fprintf(in_stack_ffffffffffffff18,"[ALSOFT] (EE) mmap commit error: %s\n",
                  in_stack_ffffffffffffff08);
        }
        break;
      }
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x232a3f);
  } while( true );
}

Assistant:

int AlsaPlayback::mixerProc()
{
    SetRTPriority();
    althrd_setname(MIXER_THREAD_NAME);

    const size_t samplebits{mDevice->bytesFromFmt() * 8};
    const snd_pcm_uframes_t update_size{mDevice->UpdateSize};
    const snd_pcm_uframes_t buffer_size{mDevice->BufferSize};
    while(!mKillNow.load(std::memory_order_acquire))
    {
        int state{verify_state(mPcmHandle)};
        if(state < 0)
        {
            ERR("Invalid state detected: %s\n", snd_strerror(state));
            mDevice->handleDisconnect("Bad state: %s", snd_strerror(state));
            break;
        }

        snd_pcm_sframes_t avails{snd_pcm_avail_update(mPcmHandle)};
        if(avails < 0)
        {
            ERR("available update failed: %s\n", snd_strerror(static_cast<int>(avails)));
            continue;
        }
        snd_pcm_uframes_t avail{static_cast<snd_pcm_uframes_t>(avails)};

        if(avail > buffer_size)
        {
            WARN("available samples exceeds the buffer size\n");
            snd_pcm_reset(mPcmHandle);
            continue;
        }

        // make sure there's frames to process
        if(avail < update_size)
        {
            if(state != SND_PCM_STATE_RUNNING)
            {
                int err{snd_pcm_start(mPcmHandle)};
                if(err < 0)
                {
                    ERR("start failed: %s\n", snd_strerror(err));
                    continue;
                }
            }
            if(snd_pcm_wait(mPcmHandle, 1000) == 0)
                ERR("Wait timeout... buffer size too low?\n");
            continue;
        }
        avail -= avail%update_size;

        // it is possible that contiguous areas are smaller, thus we use a loop
        std::lock_guard<std::mutex> _{mMutex};
        while(avail > 0)
        {
            snd_pcm_uframes_t frames{avail};

            const snd_pcm_channel_area_t *areas{};
            snd_pcm_uframes_t offset{};
            int err{snd_pcm_mmap_begin(mPcmHandle, &areas, &offset, &frames)};
            if(err < 0)
            {
                ERR("mmap begin error: %s\n", snd_strerror(err));
                break;
            }

            char *WritePtr{static_cast<char*>(areas->addr) + (offset * areas->step / 8)};
            mDevice->renderSamples(WritePtr, static_cast<ALuint>(frames), areas->step/samplebits);

            snd_pcm_sframes_t commitres{snd_pcm_mmap_commit(mPcmHandle, offset, frames)};
            if(commitres < 0 || static_cast<snd_pcm_uframes_t>(commitres) != frames)
            {
                ERR("mmap commit error: %s\n",
                    snd_strerror(commitres >= 0 ? -EPIPE : static_cast<int>(commitres)));
                break;
            }

            avail -= frames;
        }
    }

    return 0;
}